

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O1

void __thiscall
covec::Covec<float>::
initialize<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (Covec<float> *this,
          vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          *probs,mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *gen,size_t dim,float sigma,size_t neg_size,float eta0,float eta1,
          bool enable_chopout,vector<unsigned_long,_std::allocator<unsigned_long>_> *share)

{
  pointer puVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  pointer psVar7;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *pvVar8;
  size_t sVar9;
  pointer psVar10;
  pointer psVar11;
  pointer psVar12;
  pointer pdVar13;
  pointer pdVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  ulong uVar16;
  undefined8 *puVar17;
  unsigned_long uVar18;
  size_type __new_size;
  undefined3 in_register_00000089;
  Covec<float> *pCVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  result_type_conflict rVar23;
  vector<float,_std::allocator<float>_> v;
  size_t num_entries;
  vector<bool,_std::allocator<bool>_> first_of_sharings;
  normal_distribution<float> normal;
  undefined1 local_e9;
  long local_e8;
  Covec<float> *local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  allocator_type local_b9;
  size_type local_b8;
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  *local_b0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  ulong local_90;
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_88;
  vector<bool,_std::allocator<bool>_> local_80;
  normal_distribution<float> local_58;
  ulong local_48;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  *local_40;
  ulong local_38;
  
  local_e0 = (Covec<float> *)CONCAT44(local_e0._4_4_,CONCAT31(in_register_00000089,enable_chopout));
  local_e8 = CONCAT44(local_e8._4_4_,eta1);
  local_b0 = (vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
              *)CONCAT44(local_b0._4_4_,eta0);
  local_90 = CONCAT44(local_90._4_4_,sigma);
  local_40 = &this->probs_;
  std::
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  ::operator=(local_40,probs);
  this->dim_ = dim;
  this->neg_size_ = neg_size;
  this->eta0_ = local_b0._0_4_;
  this->eta1_ = (float)local_e8;
  this->chopout_enabled_ = SUB81(local_e0,0);
  puVar1 = (this->keep_dim_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->keep_dim_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keep_dim_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keep_dim_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = this;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pCVar19 = local_e0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&local_e0->share_,share);
  std::vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
  clear(&pCVar19->num_entries_);
  local_b0 = &pCVar19->vs_;
  std::
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ::clear(local_b0);
  local_88 = &pCVar19->cs_;
  std::
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::clear(local_88);
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  if ((probs->
      super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (probs->
      super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 0;
    uVar20 = 0;
    do {
      puVar1 = (share->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((puVar1 == (share->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish) || (puVar1[uVar20] == uVar18)) {
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_80,true);
        uVar18 = uVar18 + 1;
      }
      else {
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_80,false);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < (ulong)((long)(probs->
                                    super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(probs->
                                    super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  psVar2 = (local_e0->probs_).
           super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (local_e0->probs_).
           super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)psVar3 - (long)psVar2 >> 4;
  std::
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ::resize(local_b0,__new_size);
  std::
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::resize(local_88,__new_size);
  std::vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
  resize(&local_e0->num_entries_,__new_size);
  local_58._M_param._M_mean = 0.0;
  local_58._M_param._M_stddev = (float)local_90;
  local_58._M_saved = 0.0;
  local_58._M_saved_available = false;
  if (psVar3 != psVar2) {
    uVar20 = __new_size + (__new_size == 0);
    uVar22 = 0;
    local_38 = 0x800000000000003f;
    pCVar19 = local_e0;
    local_48 = uVar20;
    do {
      uVar16 = uVar22 + 0x3f;
      if (-1 < (long)uVar22) {
        uVar16 = uVar22;
      }
      if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar16 >> 6) + ((ulong)((uVar22 & local_38) < 0x8000000000000001) - 1)] >>
           (uVar22 & 0x3f) & 1) == 0) {
        psVar10 = (pCVar19->vs_).
                  super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar6 = psVar10 + (pCVar19->share_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar22];
        psVar10 = psVar10 + uVar22;
        (psVar10->
        super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr = (psVar6->
                   super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(psVar10->
                    super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,
                   &(psVar6->
                    super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
        psVar11 = (pCVar19->num_entries_).
                  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = psVar11 + (pCVar19->share_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar22];
        psVar11 = psVar11 + uVar22;
        (psVar11->super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (psVar4->super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(psVar11->super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,
                   &(psVar4->super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        psVar12 = (pCVar19->cs_).
                  super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = psVar12 + (pCVar19->share_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar22];
        psVar12 = psVar12 + uVar22;
        (psVar12->
        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr = (psVar7->
                   super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(psVar12->
                    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,
                   &(psVar7->
                    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
      }
      else {
        psVar2 = (local_40->
                 super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_e8 = uVar22 * 0x10;
        local_90 = uVar22;
        std::discrete_distribution<int>::probabilities
                  (&local_d8,
                   psVar2[uVar22].
                   super___shared_ptr<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        pdVar14 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar13 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar17 = (undefined8 *)operator_new(0x18);
        pCVar19 = local_e0;
        puVar17[1] = 0x100000001;
        *puVar17 = &PTR___Sp_counted_ptr_inplace_0011ac80;
        puVar17[2] = (long)pdVar14 - (long)pdVar13 >> 3;
        psVar4 = (local_e0->num_entries_).
                 super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 **)
         ((long)&(psVar4->super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         local_e8) = puVar17 + 2;
        p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(psVar4->super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount + local_e8);
        *(undefined8 **)
         ((long)&(psVar4->super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
         + local_e8) = puVar17;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::discrete_distribution<int>::probabilities
                  (&local_d8,
                   *(discrete_distribution<int> **)
                    ((long)&(psVar2->
                            super___shared_ptr<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + local_e8));
        pdVar14 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar13 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_b8 = (long)pdVar14 - (long)pdVar13 >> 3;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_d8,pCVar19->dim_,&local_b9);
        local_a8 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>,unsigned_long&,std::vector<float,std::allocator<float>>>
                  (a_Stack_a0,&local_a8,
                   (allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                    *)&local_e9,&local_b8,(vector<float,_std::allocator<float>_> *)&local_d8);
        _Var15._M_pi = a_Stack_a0[0]._M_pi;
        pvVar8 = local_a8;
        psVar6 = (local_b0->
                 super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_a8 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)0x0;
        a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(psVar6->
                          super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_refcount._M_pi + local_e8);
        puVar17 = (undefined8 *)
                  ((long)&(psVar6->
                          super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + local_e8);
        *puVar17 = pvVar8;
        puVar17[1] = _Var15._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        if (a_Stack_a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_a0[0]._M_pi);
        }
        if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> **)&local_d8,
                   (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                   &local_a8,&local_b8);
        pdVar14 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar13 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        psVar7 = (local_88->
                 super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(psVar7->
                          super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_refcount._M_pi + local_e8);
        puVar17 = (undefined8 *)
                  ((long)&(psVar7->
                          super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + local_e8);
        *puVar17 = pdVar13;
        puVar17[1] = pdVar14;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        }
        pvVar8 = *(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   **)((long)&(((local_b0->
                                super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + local_e8);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize(pvVar8,local_b8);
        if (local_b8 != 0) {
          uVar20 = 0;
          do {
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_d8,pCVar19->dim_,
                       (allocator_type *)&local_a8);
            sVar9 = pCVar19->dim_;
            if (sVar9 != 0) {
              sVar21 = 0;
              do {
                rVar23 = std::normal_distribution<float>::operator()
                                   (&local_58,gen,&local_58._M_param);
                *(result_type_conflict *)
                 ((long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + sVar21 * 4) = rVar23;
                sVar21 = sVar21 + 1;
              } while (sVar9 != sVar21);
            }
            std::vector<float,_std::allocator<float>_>::operator=
                      ((pvVar8->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar20,
                       (vector<float,_std::allocator<float>_> *)&local_d8);
            if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            uVar20 = uVar20 + 1;
            pCVar19 = local_e0;
          } while (uVar20 < local_b8);
        }
        local_a8 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)((ulong)local_a8 & 0xffffffff00000000);
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long&,int>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> **)&local_d8,
                   (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                   &local_e9,&local_b8,(int *)&local_a8);
        uVar20 = local_48;
        pdVar14 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar13 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        psVar7 = (local_88->
                 super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(psVar7->
                          super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_refcount._M_pi + local_e8);
        puVar17 = (undefined8 *)
                  ((long)&(psVar7->
                          super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + local_e8);
        *puVar17 = pdVar13;
        puVar17[1] = pdVar14;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        uVar22 = local_90;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          uVar22 = local_90;
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar20);
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Covec<Real>::initialize(const std::vector<std::shared_ptr<std::discrete_distribution<int> > >& probs,
                               RandomGenerator& gen,
                               const std::size_t dim,
                               const Real sigma,
                               const std::size_t neg_size,
                               const Real eta0,
                               const Real eta1,
			       const bool enable_chopout,
                               const std::vector<std::size_t>& share
                               )
  {
    this->probs_ = probs;
    this->dim_ = dim;
    this->neg_size_ = neg_size;
    this->eta0_ = eta0;
    this->eta1_ = eta1;
    this->chopout_enabled_ = enable_chopout;
    this->keep_dim_ = std::vector<std::size_t>();
    this->share_ = share;

    this->num_entries_.clear();
    this->vs_.clear();
    this->cs_.clear();

    std::vector<bool> first_of_sharings;
    {
      std::size_t counter=0;
      for(std::size_t i=0; i < probs.size(); ++i){
        if(share.empty() || share[i] == counter){
          first_of_sharings.push_back(true);
          ++counter;
        }else{
          first_of_sharings.push_back(false);
        }
      }
    }

    std::size_t order = this->probs_.size();
    this->vs_.resize(order);
    this->cs_.resize(order);
    this->num_entries_.resize(order);
    std::normal_distribution<Real> normal(0.0, sigma);
    for(std::size_t i = 0; i < order; ++i){
      if(!first_of_sharings[i]){
        assert(this->probs_[i] == this->probs_[this->share_[i]]);
        this->vs_[i] = this->vs_[this->share_[i]];
        this->num_entries_[i] = this->num_entries_[this->share_[i]];
        this->cs_[i] = this->cs_[this->share_[i]];
      }else{
        const auto& prob = this->probs_[i];

        // allocate
        this->num_entries_[i] =
          std::make_shared<std::size_t>(prob->probabilities().size());
        std::size_t num_entries = prob->probabilities().size();
        this->vs_[i] =
          std::make_shared<std::vector<std::vector<Real> > >
          (num_entries, std::vector<Real>(this->dimension()));
        this->cs_[i] =
          std::make_shared<std::vector<std::size_t> >(num_entries);
	   
        auto& vs = *this->vs_[i];
        vs.resize(num_entries);
        for(std::size_t j = 0; j < num_entries; ++j){
          std::vector<Real> v(this->dim_);
          for(std::size_t k = 0, K = this->dimension(); k < K; ++k){
            v[k] = normal(gen);
          }
          vs[j] = v;
        }
        this->cs_[i] = std::make_shared<std::vector<std::size_t> >(num_entries, 0);
      }
    }
  }